

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

bool __thiscall kj::StringPtr::endsWith(StringPtr *this,StringPtr *other)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *__s2;
  bool local_19;
  StringPtr *other_local;
  StringPtr *this_local;
  
  sVar2 = ArrayPtr<const_char>::size(&other->content);
  sVar3 = ArrayPtr<const_char>::size(&this->content);
  local_19 = false;
  if (sVar2 <= sVar3) {
    pcVar4 = end(this);
    sVar2 = size(other);
    __s2 = ArrayPtr<const_char>::begin(&other->content);
    sVar3 = size(other);
    iVar1 = memcmp(pcVar4 + -sVar2,__s2,sVar3);
    local_19 = iVar1 == 0;
  }
  return local_19;
}

Assistant:

inline bool StringPtr::endsWith(const StringPtr& other) const {
  return other.content.size() <= content.size() &&
      memcmp(end() - other.size(), other.content.begin(), other.size()) == 0;
}